

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall llvm::detail::IEEEFloat::mod(IEEEFloat *this,IEEEFloat *rhs)

{
  byte bVar1;
  opStatus oVar2;
  cmpResult cVar3;
  byte bVar4;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  IEEEFloat V;
  IEEEFloat local_78;
  IEEEFloat local_60;
  IEEEFloat local_48;
  
  oVar2 = modSpecials(this,rhs);
  bVar1 = this->field_0x12;
  bVar4 = bVar1 & 8;
  while( true ) {
    if (((((bVar1 & 6) == 0) || ((bVar1 & 7) == 3)) || ((rhs->field_0x12 & 6) == 0)) ||
       ((rhs->field_0x12 & 7) == 3)) goto LAB_0017aea9;
    cVar3 = compareAbsoluteValue(this,rhs);
    if (cVar3 == cmpLessThan) break;
    IEEEFloat(&local_48,rhs);
    ilogb(__x);
    ilogb(__x_00);
    scalbn(__x_01,(int)&V);
    ~IEEEFloat(&local_48);
    cVar3 = compareAbsoluteValue(this,&V);
    if (cVar3 == cmpLessThan) {
      IEEEFloat(&local_78,&V);
      scalbn(__x_02,(int)&local_60);
      operator=(&V,&local_60);
      ~IEEEFloat(&local_60);
      ~IEEEFloat(&local_78);
    }
    V._18_1_ = V._18_1_ & 0xf7 | this->field_0x12 & 8;
    oVar2 = subtract(this,&V,rmNearestTiesToEven);
    if (oVar2 != opOK) {
      __assert_fail("fs==opOK",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x6df,"IEEEFloat::opStatus llvm::detail::IEEEFloat::mod(const IEEEFloat &)");
    }
    ~IEEEFloat(&V);
    bVar1 = this->field_0x12;
    oVar2 = opOK;
  }
  bVar1 = this->field_0x12;
LAB_0017aea9:
  if ((bVar1 & 7) == 3) {
    this->field_0x12 = bVar1 & 0xf3 | bVar4;
  }
  return oVar2;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::mod(const IEEEFloat &rhs) {
  opStatus fs;
  fs = modSpecials(rhs);
  unsigned int origSign = sign;

  while (isFiniteNonZero() && rhs.isFiniteNonZero() &&
         compareAbsoluteValue(rhs) != cmpLessThan) {
    IEEEFloat V = scalbn(rhs, ilogb(*this) - ilogb(rhs), rmNearestTiesToEven);
    if (compareAbsoluteValue(V) == cmpLessThan)
      V = scalbn(V, -1, rmNearestTiesToEven);
    V.sign = sign;

    fs = subtract(V, rmNearestTiesToEven);
    assert(fs==opOK);
  }
  if (isZero())
    sign = origSign; // fmod requires this
  return fs;
}